

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O1

void predict_iforest(float *numeric_data,int *categ_data,bool is_col_major,size_t ncols_numeric,
                    size_t ncols_categ,float *Xc,int64_t *Xc_ind,int64_t *Xc_indptr,float *Xr,
                    int64_t *Xr_ind,int64_t *Xr_indptr,size_t nrows,int nthreads,bool standardize,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *output_depths,
                    int64_t *tree_num,double *per_tree_depths,TreesIndexer *indexer)

{
  pointer pSVar1;
  pointer pvVar2;
  pointer puVar3;
  size_t sVar4;
  ulong uVar5;
  double *pdVar6;
  ExtIsoForest *pEVar7;
  undefined8 uVar8;
  long *plVar9;
  long lVar10;
  int64_t *piVar11;
  size_t row;
  double *pdVar12;
  pointer pvVar13;
  pointer pvVar14;
  undefined4 uVar15;
  uint7 uVar18;
  double *pdVar16;
  long lVar17;
  double *pdVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dStack_f8;
  size_t sStack_f0;
  double *pdStack_e8;
  double dStack_e0;
  size_t sStack_d0;
  long lStack_c8;
  long alStack_c0 [2];
  int iStack_ac;
  size_t sStack_a8;
  int *piStack_a0;
  ulong uStack_98;
  PredictionData<float,_long> PStack_90;
  
  if (nrows == 0) {
    return;
  }
  PStack_90.nrows = nrows;
  PStack_90.Xc_ind = Xc_ind;
  PStack_90.Xc_indptr = Xc_indptr;
  PStack_90.Xr = Xr;
  PStack_90.Xr_ind = Xr_ind;
  PStack_90.Xr_indptr = Xr_indptr;
  iStack_ac = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    iStack_ac = nthreads;
  }
  uVar18 = (uint7)((ulong)Xr >> 8);
  pdVar16 = (double *)((ulong)uVar18 << 8);
  piStack_a0 = categ_data;
  PStack_90.numeric_data = numeric_data;
  PStack_90.categ_data = categ_data;
  PStack_90.is_col_major = is_col_major;
  PStack_90.ncols_numeric = ncols_numeric;
  PStack_90.ncols_categ = ncols_categ;
  PStack_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (int64_t *)0x0) {
    pdVar16 = output_depths;
    batched_csc_predict<float,long>
              (&PStack_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
  }
  else if (model_outputs == (IsoForest *)0x0) {
    if ((((Xc_indptr == (int64_t *)0x0) && (Xr_indptr == (int64_t *)0x0)) &&
        (categ_data == (int *)0x0)) &&
       ((model_outputs_ext->missing_action == Fail &&
        (model_outputs_ext->has_range_penalty == false)))) {
      if (nrows == 1 || !is_col_major) {
        pdStack_e8 = (double *)(nrows * 8);
        lVar10 = 0;
        sVar4 = 0;
        do {
          dStack_f8 = 0.0;
          pvVar13 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13;
          if (lVar20 != 0) {
            uVar5 = (lVar20 >> 3) * -0x5555555555555555;
            lVar20 = 0;
            uVar21 = 0;
            pdVar12 = per_tree_depths;
            pdVar6 = (double *)tree_num;
            do {
              pdVar16 = pdVar6;
              if (tree_num == (int64_t *)0x0) {
                pdVar16 = (double *)tree_num;
              }
              pdVar19 = (double *)(uVar5 * lVar10 + (long)pdVar12);
              if (per_tree_depths == (double *)0x0) {
                pdVar19 = (double *)0x0;
              }
              traverse_hplane_fast_rowmajor<float,long>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar13->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar20),model_outputs_ext,
                         PStack_90.numeric_data + PStack_90.ncols_numeric * sVar4,&dStack_f8,
                         (long *)pdVar16,pdVar19,sVar4);
              uVar21 = uVar21 + 1;
              pvVar13 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                      -0x5555555555555555;
              pdVar6 = (double *)((long)pdVar6 + (long)pdStack_e8);
              pdVar12 = pdVar12 + 1;
              lVar20 = lVar20 + 0x18;
            } while (uVar21 < uVar5);
          }
          output_depths[sVar4] = dStack_f8;
          sVar4 = sVar4 + 1;
          lVar10 = lVar10 + 8;
        } while (sVar4 != nrows);
      }
      else {
        pdStack_e8 = (double *)(nrows * 8);
        lVar10 = 0;
        sVar4 = 0;
        do {
          dStack_f8 = 0.0;
          pvVar13 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13;
          if (lVar20 != 0) {
            uVar5 = (lVar20 >> 3) * -0x5555555555555555;
            lVar20 = 0;
            uVar21 = 0;
            pdVar12 = (double *)tree_num;
            pdVar6 = per_tree_depths;
            do {
              pdVar16 = pdVar12;
              if (tree_num == (int64_t *)0x0) {
                pdVar16 = (double *)tree_num;
              }
              pdVar19 = (double *)(uVar5 * lVar10 + (long)pdVar6);
              if (per_tree_depths == (double *)0x0) {
                pdVar19 = (double *)0x0;
              }
              traverse_hplane_fast_colmajor<PredictionData<float,long>,long>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar13->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar20),model_outputs_ext,&PStack_90,&dStack_f8,
                         (long *)pdVar16,pdVar19,sVar4);
              uVar21 = uVar21 + 1;
              pvVar13 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                      -0x5555555555555555;
              pdVar12 = (double *)((long)pdVar12 + (long)pdStack_e8);
              pdVar6 = pdVar6 + 1;
              lVar20 = lVar20 + 0x18;
            } while (uVar21 < uVar5);
          }
          output_depths[sVar4] = dStack_f8;
          sVar4 = sVar4 + 1;
          lVar10 = lVar10 + 8;
        } while (sVar4 != nrows);
      }
    }
    else {
      sStack_d0 = nrows + (nrows == 0);
      sStack_f0 = nrows * 8;
      sVar4 = 0;
      pdStack_e8 = (double *)0x0;
      do {
        dStack_f8 = 0.0;
        pvVar13 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)(model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13;
        if (lVar10 != 0) {
          uVar5 = (lVar10 >> 3) * -0x5555555555555555;
          lVar10 = 0;
          uVar21 = 0;
          piVar11 = tree_num;
          pdVar16 = per_tree_depths;
          do {
            plVar9 = piVar11;
            if (tree_num == (int64_t *)0x0) {
              plVar9 = tree_num;
            }
            pdVar12 = (double *)(uVar5 * (long)pdStack_e8 + (long)pdVar16);
            if (per_tree_depths == (double *)0x0) {
              pdVar12 = (double *)0x0;
            }
            traverse_hplane<PredictionData<float,long>,long,ImputedData<long,double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       ((long)&(pvVar13->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl + lVar10),model_outputs_ext,&PStack_90,&dStack_f8,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                       (ImputedData<long,_double> *)0x0,plVar9,pdVar12,sVar4);
            uVar21 = uVar21 + 1;
            pvVar13 = (model_outputs_ext->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(model_outputs_ext->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
                    -0x5555555555555555;
            piVar11 = (int64_t *)((long)piVar11 + sStack_f0);
            pdVar16 = pdVar16 + 1;
            lVar10 = lVar10 + 0x18;
          } while (uVar21 < uVar5);
        }
        output_depths[sVar4] = dStack_f8;
        sVar4 = sVar4 + 1;
        pdVar16 = pdStack_e8 + 1;
        pdStack_e8 = pdVar16;
      } while (sVar4 != sStack_d0);
    }
  }
  else {
    if (model_outputs->missing_action == Fail) {
      if (model_outputs->new_cat_action == Weighted) {
        bVar22 = model_outputs->cat_split_type == SingleCateg;
        pdVar16 = (double *)CONCAT71(uVar18,bVar22);
        if (((Xc_indptr == (int64_t *)0x0) && (Xr_indptr == (int64_t *)0x0)) &&
           (categ_data == (int *)0x0 || bVar22)) goto LAB_00149426;
      }
      else if (Xc_indptr == (int64_t *)0x0 && Xr_indptr == (int64_t *)0x0) {
LAB_00149426:
        if (model_outputs->has_range_penalty == false) {
          sStack_f0 = nrows + (nrows == 0);
          if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
            sStack_d0 = nrows * 8;
            pdStack_e8 = (double *)0x0;
            sVar4 = 0;
            do {
              dStack_f8 = 0.0;
              pvVar14 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar10 = (long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14;
              if (lVar10 != 0) {
                uVar5 = (lVar10 >> 3) * -0x5555555555555555;
                lVar10 = 0;
                uVar21 = 0;
                pdVar12 = per_tree_depths;
                pdVar6 = (double *)tree_num;
                do {
                  pdVar16 = pdVar6;
                  if (tree_num == (int64_t *)0x0) {
                    pdVar16 = (double *)tree_num;
                  }
                  pdVar19 = (double *)(uVar5 * (long)pdStack_e8 + (long)pdVar12);
                  if (per_tree_depths == (double *)0x0) {
                    pdVar19 = (double *)0x0;
                  }
                  traverse_itree_fast<float,long>
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                             ((long)&(pvVar14->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                     )._M_impl + lVar10),model_outputs,
                             PStack_90.numeric_data + PStack_90.ncols_numeric * sVar4,&dStack_f8,
                             (long *)pdVar16,pdVar19,sVar4);
                  uVar21 = uVar21 + 1;
                  pvVar14 = (model_outputs->trees).
                            super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar5 = ((long)(model_outputs->trees).
                                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3) *
                          -0x5555555555555555;
                  pdVar6 = (double *)((long)pdVar6 + sStack_d0);
                  pdVar12 = pdVar12 + 1;
                  lVar10 = lVar10 + 0x18;
                } while (uVar21 < uVar5);
              }
              output_depths[sVar4] = dStack_f8;
              sVar4 = sVar4 + 1;
              pdStack_e8 = (double *)((long)pdStack_e8 + 8);
            } while (sVar4 != sStack_f0);
          }
          else {
            sStack_d0 = nrows * 8;
            lVar10 = 0;
            pdStack_e8 = (double *)0x0;
            do {
              dStack_f8 = 0.0;
              pvVar14 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar20 = (long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14;
              if (lVar20 != 0) {
                uVar5 = (lVar20 >> 3) * -0x5555555555555555;
                lVar20 = 0;
                uVar21 = 0;
                pdVar12 = (double *)tree_num;
                pdVar6 = per_tree_depths;
                do {
                  pdVar16 = pdVar12;
                  if (tree_num == (int64_t *)0x0) {
                    pdVar16 = (double *)tree_num;
                  }
                  pdVar19 = (double *)(uVar5 * lVar10 + (long)pdVar6);
                  if (per_tree_depths == (double *)0x0) {
                    pdVar19 = (double *)0x0;
                  }
                  traverse_itree_no_recurse<PredictionData<float,long>,long>
                            ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                             ((long)&(pvVar14->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                     )._M_impl + lVar20),model_outputs,&PStack_90,&dStack_f8,
                             (long *)pdVar16,pdVar19,(size_t)pdStack_e8);
                  uVar21 = uVar21 + 1;
                  pvVar14 = (model_outputs->trees).
                            super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar5 = ((long)(model_outputs->trees).
                                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3) *
                          -0x5555555555555555;
                  pdVar12 = (double *)((long)pdVar12 + sStack_d0);
                  pdVar6 = pdVar6 + 1;
                  lVar20 = lVar20 + 0x18;
                } while (uVar21 < uVar5);
              }
              output_depths[(long)pdStack_e8] = dStack_f8;
              pdStack_e8 = (double *)((long)pdStack_e8 + 1);
              lVar10 = lVar10 + 8;
            } while (pdStack_e8 != (double *)sStack_f0);
          }
          goto LAB_00148f17;
        }
      }
    }
    sVar4 = nrows + (nrows == 0);
    lStack_c8 = 0;
    sStack_d0 = nrows * 8;
    sStack_f0 = 0;
    uVar5 = 0;
    row = 0;
    sStack_a8 = sVar4;
    do {
      if ((uVar5 & 1) == 0) {
        pvVar14 = (model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)(model_outputs->trees).
                       super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14;
        uStack_98 = uVar5;
        if (lVar10 == 0) {
          dVar25 = 0.0;
        }
        else {
          uVar5 = (lVar10 >> 3) * -0x5555555555555555;
          dVar25 = 0.0;
          lVar10 = 0;
          uVar21 = 0;
          piVar11 = tree_num;
          pdVar12 = per_tree_depths;
          do {
            plVar9 = piVar11;
            if (tree_num == (int64_t *)0x0) {
              plVar9 = tree_num;
            }
            pdVar6 = (double *)(uVar5 * sStack_f0 + (long)pdVar12);
            if (per_tree_depths == (double *)0x0) {
              pdVar6 = (double *)0x0;
            }
            pdVar16 = (double *)0x0;
            pdStack_e8 = (double *)dVar25;
            dVar25 = traverse_itree<PredictionData<float,long>,long,ImputedData<long,double>>
                               ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                ((long)&(pvVar14->
                                        super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                        _M_impl + lVar10),model_outputs,&PStack_90,
                                (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                (ImputedData<long,_double> *)0x0,0.0,row,plVar9,pdVar6,0);
            dVar25 = (double)pdStack_e8 + dVar25;
            uVar21 = uVar21 + 1;
            pvVar14 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3) *
                    -0x5555555555555555;
            piVar11 = (int64_t *)((long)piVar11 + sStack_d0);
            pdVar12 = pdVar12 + 1;
            lVar10 = lVar10 + 0x18;
          } while (uVar21 < uVar5);
        }
        output_depths[row] = dVar25;
        sVar4 = sStack_a8;
        uVar5 = uStack_98;
      }
      row = row + 1;
      sStack_f0 = sStack_f0 + 8;
    } while (row != sVar4);
    if ((uVar5 & 1) != 0) {
      alStack_c0[0] = lStack_c8;
      if (lStack_c8 != 0) {
        std::__exception_ptr::exception_ptr::_M_addref();
      }
      uVar8 = std::rethrow_exception((exception_ptr)alStack_c0);
      if (lStack_c8 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
      _Unwind_Resume(uVar8);
    }
    if (lStack_c8 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
LAB_00148f17:
  pEVar7 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar7 = model_outputs_ext;
  }
  lVar10 = ((long)(pEVar7->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar7->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar22 = true, model_outputs->scoring_metric != Density)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar22 = false;
    }
    else {
      bVar22 = model_outputs_ext->scoring_metric == Density;
    }
  }
  auVar26._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar26._0_8_ = lVar10;
  auVar26._12_4_ = 0x45300000;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar23 = true, model_outputs->scoring_metric != BoxedRatio)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar23 = false;
    }
    else {
      bVar23 = model_outputs_ext->scoring_metric == BoxedRatio;
    }
  }
  dStack_e0 = auVar26._8_8_ - 1.9342813113834067e+25;
  if (model_outputs != (IsoForest *)0x0) {
    pdVar16 = (double *)CONCAT71((int7)((ulong)pdVar16 >> 8),1);
    uVar15 = SUB84(pdVar16,0);
    if (model_outputs->scoring_metric == BoxedDensity) goto LAB_00148fc3;
  }
  if (model_outputs_ext == (ExtIsoForest *)0x0) {
    uVar15 = 0;
  }
  else {
    uVar15 = (undefined4)
             CONCAT71((int7)((ulong)pdVar16 >> 8),model_outputs_ext->scoring_metric == BoxedDensity)
    ;
  }
LAB_00148fc3:
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar24 = true, model_outputs->scoring_metric != BoxedDensity2)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = model_outputs_ext->scoring_metric == BoxedDensity2;
    }
  }
  pdStack_e8 = (double *)
               (dStack_e0 + ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
  sStack_f0 = CONCAT44(sStack_f0._4_4_,uVar15);
  if (standardize) {
    if (bVar22 || bVar24) {
      lVar10 = 0;
      do {
        output_depths[lVar10] = output_depths[lVar10] / -(double)pdStack_e8;
        lVar10 = lVar10 + 1;
      } while (nrows + (nrows == 0) != lVar10);
    }
    else {
      lVar10 = nrows + (nrows == 0);
      if ((char)uVar15 == '\0') {
        if (bVar23) {
          lVar20 = 0;
          do {
            output_depths[lVar20] = output_depths[lVar20] / (double)pdStack_e8;
            lVar20 = lVar20 + 1;
          } while (lVar10 != lVar20);
        }
        else {
          pdStack_e8 = (double *)((double)pdStack_e8 * pEVar7->exp_avg_depth);
          lVar20 = 0;
          do {
            dVar25 = exp2(-output_depths[lVar20] / (double)pdStack_e8);
            output_depths[lVar20] = dVar25;
            lVar20 = lVar20 + 1;
          } while (lVar10 != lVar20);
        }
      }
      else {
        lVar20 = 0;
        do {
          dVar25 = exp(output_depths[lVar20] / (double)pdStack_e8);
          output_depths[lVar20] = -dVar25;
          lVar20 = lVar20 + 1;
        } while (lVar10 != lVar20);
      }
    }
  }
  else if ((bVar22 || (char)uVar15 != '\0') || bVar24) {
    lVar10 = 0;
    do {
      dVar25 = exp(output_depths[lVar10] / (double)pdStack_e8);
      output_depths[lVar10] = dVar25;
      lVar10 = lVar10 + 1;
    } while (nrows + (nrows == 0) != lVar10);
  }
  else if (bVar23) {
    lVar10 = 0;
    do {
      output_depths[lVar10] = output_depths[lVar10] / -(double)pdStack_e8;
      lVar10 = lVar10 + 1;
    } while (nrows + (nrows == 0) != lVar10);
  }
  else {
    lVar10 = 0;
    do {
      output_depths[lVar10] = output_depths[lVar10] / (double)pdStack_e8;
      lVar10 = lVar10 + 1;
    } while (nrows + (nrows == 0) != lVar10);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar22 || (sStack_f0 & 1) != 0) || bVar24)) {
    pEVar7 = (ExtIsoForest *)model_outputs;
    if (model_outputs == (IsoForest *)0x0) {
      pEVar7 = model_outputs_ext;
    }
    lVar10 = nrows * -0x5555555555555555 *
             ((long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar10 != 0) {
      lVar20 = 0;
      do {
        dVar25 = exp(per_tree_depths[lVar20]);
        per_tree_depths[lVar20] = dVar25;
        lVar20 = lVar20 + 1;
      } while (lVar10 - lVar20 != 0);
    }
  }
  if (tree_num != (int64_t *)0x0) {
    if ((indexer != (TreesIndexer *)0x0) &&
       (pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar1 != (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      pEVar7 = (ExtIsoForest *)model_outputs;
      if (model_outputs == (IsoForest *)0x0) {
        pEVar7 = model_outputs_ext;
      }
      pvVar13 = (pEVar7->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (pEVar7->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((model_outputs == (IsoForest *)0x0) ||
         ((model_outputs->missing_action != Divide &&
          (((model_outputs->new_cat_action != Weighted || (piStack_a0 == (int *)0x0)) ||
           (model_outputs->cat_split_type != SubSet)))))) {
        if (pvVar2 == pvVar13) {
          return;
        }
        lVar20 = ((long)pvVar2 - (long)pvVar13 >> 3) * -0x5555555555555555;
        lVar10 = 0;
        do {
          puVar3 = pSVar1[lVar10].terminal_node_mappings.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar17 = 0;
          do {
            tree_num[lVar17] = puVar3[tree_num[lVar17]];
            lVar17 = lVar17 + 1;
          } while (nrows + (nrows == 0) != lVar17);
          lVar10 = lVar10 + 1;
          tree_num = tree_num + nrows;
        } while (lVar10 != lVar20 + (ulong)(lVar20 == 0));
        return;
      }
    }
    remap_terminal_trees<PredictionData<float,long>,long>
              (model_outputs,model_outputs_ext,&PStack_90,tree_num,iStack_ac);
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void predict_iforest(real_t numeric_data[], int categ_data[],
                     bool is_col_major, size_t ncols_numeric, size_t ncols_categ,
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double output_depths[],   sparse_ix tree_num[],
                     double per_tree_depths[],
                     TreesIndexer *indexer)
{
    predict_iforest<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     is_col_major, ncols_numeric, ncols_categ,
                     Xc, Xc_ind, Xc_indptr,
                     Xr, Xr_ind, Xr_indptr,
                     nrows, nthreads, standardize,
                     model_outputs, model_outputs_ext,
                     output_depths,   tree_num,
                     per_tree_depths,
                     indexer);
}